

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

void __thiscall QWizard::setStartId(QWizard *this,int theid)

{
  bool bVar1;
  QWizardPrivate *this_00;
  size_type_conflict sVar2;
  uint *puVar3;
  uint in_ESI;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  QWizardPrivate *d;
  int newStart;
  undefined4 in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb8;
  char local_38 [32];
  const_iterator local_18;
  uint local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QWizard *)0x7baf99);
  local_c = in_ESI;
  if (in_ESI == 0xffffffff) {
    sVar2 = QMap<int,_QWizardPage_*>::size((QMap<int,_QWizardPage_*> *)this_00);
    if (sVar2 == 0) {
      in_stack_ffffffffffffffac = 0xffffffff;
      local_c = in_stack_ffffffffffffffac;
    }
    else {
      local_18._M_node =
           (_Base_ptr)
           QMap<int,_QWizardPage_*>::constBegin
                     ((QMap<int,_QWizardPage_*> *)
                      CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      puVar3 = (uint *)QMap<int,_QWizardPage_*>::const_iterator::key((const_iterator *)0x7bafe4);
      in_stack_ffffffffffffffac = *puVar3;
      local_c = in_stack_ffffffffffffffac;
    }
  }
  if (this_00->start == local_c) {
    this_00->startSetByUser = in_ESI != 0xffffffff;
  }
  else {
    bVar1 = QMap<int,_QWizardPage_*>::contains
                      ((QMap<int,_QWizardPage_*> *)in_RDI,
                       (int *)CONCAT44(in_ESI,in_stack_ffffffffffffffb8));
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      this_00->start = local_c;
      this_00->startSetByUser = in_ESI != 0xffffffff;
    }
    else {
      QMessageLogger::QMessageLogger
                (in_RDI,(char *)CONCAT44(in_ESI,in_stack_ffffffffffffffb8),
                 (int)((ulong)this_00 >> 0x20),
                 (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      QMessageLogger::warning(local_38,"QWizard::setStartId: Invalid page ID %d",(ulong)local_c);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWizard::setStartId(int theid)
{
    Q_D(QWizard);
    int newStart = theid;
    if (theid == -1)
        newStart = d->pageMap.size() ? d->pageMap.constBegin().key() : -1;

    if (d->start == newStart) {
        d->startSetByUser = theid != -1;
        return;
    }

    if (Q_UNLIKELY(!d->pageMap.contains(newStart))) {
        qWarning("QWizard::setStartId: Invalid page ID %d", newStart);
        return;
    }
    d->start = newStart;
    d->startSetByUser = theid != -1;
}